

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O3

void __thiscall
slang::ast::InstanceCacheKey::InstanceCacheKey
          (InstanceCacheKey *this,InstanceSymbol *symbol,bool *valid)

{
  pointer ppPVar1;
  InstanceBodySymbol *pIVar2;
  size_t sVar3;
  pointer ppPVar4;
  ParameterSymbol *this_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  InstanceCacheKey *pIVar8;
  DefinitionSymbol *pDVar9;
  ConstantValue *this_01;
  ulong uVar10;
  Type *this_02;
  pointer ppPVar11;
  InstanceSymbol *symbol_00;
  uint64_t uVar12;
  long lVar13;
  bool *valid_00;
  ulong uVar14;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> sVar15;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hasher;
  InstanceCacheKey ifaceKey;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> local_89;
  vector<std::pair<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*>,std::allocator<std::pair<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*>>>
  *local_88;
  bool *local_80;
  IfaceConn local_78;
  InstanceSymbol *local_68;
  InstanceCacheKey *local_60;
  InstanceCacheKey local_58;
  
  (this->symbol).ptr = symbol;
  local_88 = (vector<std::pair<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*>,std::allocator<std::pair<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*>>>
              *)&this->ifaceKeys;
  (this->ifaceKeys).
  super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ifaceKeys).
  super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ifaceKeys).
  super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = valid;
  local_60 = this;
  pDVar9 = InstanceSymbol::getDefinition(symbol);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = pDVar9;
  pIVar2 = symbol->body;
  if ((pIVar2->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&pIVar2->super_Scope);
  }
  uVar14 = (SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0)) + 0x9e3779b9;
  sVar3 = (pIVar2->parameters)._M_extent._M_extent_value;
  local_68 = symbol;
  if (sVar3 != 0) {
    ppPVar4 = (pIVar2->parameters)._M_ptr;
    lVar13 = 0;
    do {
      this_00 = (ParameterSymbol *)**(undefined8 **)((long)ppPVar4 + lVar13);
      if ((this_00->super_ValueSymbol).super_Symbol.kind == Parameter) {
        this_01 = ParameterSymbol::getValue(this_00,(SourceRange)ZEXT816(0));
        uVar10 = ConstantValue::hash(this_01);
      }
      else {
        this_02 = DeclaredType::getType
                            ((DeclaredType *)&(this_00->super_ValueSymbol).declaredType.dimensions);
        uVar10 = Type::hash(this_02);
      }
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar10;
      uVar14 = uVar14 * 0x40 + 0x9e3779b9 + (uVar14 >> 2) +
               (SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0)) ^ uVar14;
      lVar13 = lVar13 + 8;
    } while (sVar3 << 3 != lVar13);
  }
  sVar15 = InstanceSymbol::getPortConnections(local_68);
  pIVar8 = local_60;
  ppPVar11 = sVar15._M_ptr;
  if (sVar15._M_extent._M_extent_value._M_extent_value != 0) {
    ppPVar1 = ppPVar11 + sVar15._M_extent._M_extent_value._M_extent_value;
    valid_00 = local_80;
    do {
      if ((*ppPVar11)->port->kind == InterfacePort) {
        local_78 = PortConnection::getIfaceConn(*ppPVar11);
        symbol_00 = (InstanceSymbol *)local_78.first;
        while (symbol_00 != (InstanceSymbol *)0x0) {
          if ((symbol_00->super_InstanceSymbolBase).super_Symbol.kind != InstanceArray) {
            if (((symbol_00->resolvedConfig != (ResolvedConfig *)0x0) ||
                (symbol_00->body->hierarchyOverrideNode != (HierarchyOverrideNode *)0x0)) ||
               ((symbol_00->body->flags).m_bits != '\0')) {
              *valid_00 = false;
              return;
            }
            InstanceCacheKey(&local_58,symbol_00,valid_00);
            if (*valid_00 == false) {
              std::
              vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
              ::~vector(&local_58.ifaceKeys);
              return;
            }
            std::
            vector<std::pair<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*>,std::allocator<std::pair<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*>>>
            ::emplace_back<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*&>
                      (local_88,&local_58,&local_78.second);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = (pIVar8->ifaceKeys).
                           super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].first.savedHash;
            uVar14 = uVar14 * 0x40 + 0x9e3779b9 + (uVar14 >> 2) +
                     (SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar7,8) ^
                     SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar7,0)) ^ uVar14;
            if (local_78.second != (ModportSymbol *)0x0) {
              uVar12 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 (&local_89,&((local_78.second)->super_Symbol).name);
              uVar14 = uVar14 ^ (uVar14 >> 2) + uVar12 + uVar14 * 0x40 + 0x9e3779b9;
            }
            std::
            vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
            ::~vector(&local_58.ifaceKeys);
            valid_00 = local_80;
            break;
          }
          if (*(int *)&(symbol_00->connections)._M_ptr != 0) {
            Scope::elaborate((Scope *)&(symbol_00->super_InstanceSymbolBase).arrayPath);
          }
          if (symbol_00->resolvedConfig == (ResolvedConfig *)0x0) break;
          symbol_00 = *(InstanceSymbol **)&symbol_00->canonicalBody->super_Symbol;
          local_78.first = (Symbol *)symbol_00;
        }
      }
      ppPVar11 = ppPVar11 + 1;
    } while (ppPVar11 != ppPVar1);
  }
  pIVar8->savedHash = uVar14;
  return;
}

Assistant:

InstanceCacheKey::InstanceCacheKey(const InstanceSymbol& symbol, bool& valid) : symbol(&symbol) {
    size_t h = 0;
    hash_combine(h, &symbol.getDefinition());

    for (auto param : symbol.body.getParameters()) {
        if (param->symbol.kind == SymbolKind::Parameter)
            hash_combine(h, param->symbol.as<ParameterSymbol>().getValue().hash());
        else
            hash_combine(h, param->symbol.as<TypeParameterSymbol>().targetType.getType().hash());
    }

    for (auto conn : symbol.getPortConnections()) {
        if (conn->port.kind == SymbolKind::InterfacePort) {
            auto [iface, modport] = conn->getIfaceConn();
            while (iface && iface->kind == SymbolKind::InstanceArray) {
                auto& arr = iface->as<InstanceArraySymbol>();
                if (arr.empty())
                    iface = nullptr;
                else
                    iface = arr.elements[0];
            }

            if (iface) {
                auto& ifaceInst = iface->as<InstanceSymbol>();
                if (!isEligibleForCaching(ifaceInst)) {
                    valid = false;
                    return;
                }

                InstanceCacheKey ifaceKey(ifaceInst, valid);
                if (!valid)
                    return;

                ifaceKeys.emplace_back(std::move(ifaceKey), modport);
                hash_combine(h, ifaceKeys.back().first.savedHash);

                if (modport)
                    hash_combine(h, modport->name);
            }
        }
    }

    savedHash = h;
}